

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSIMDLoadStoreLaneSetPtr(BinaryenExpressionRef expr,BinaryenExpressionRef ptrExpr)

{
  if (expr->_id != SIMDLoadStoreLaneId) {
    __assert_fail("expression->is<SIMDLoadStoreLane>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xd70,
                  "void BinaryenSIMDLoadStoreLaneSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (ptrExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 3) = ptrExpr;
    return;
  }
  __assert_fail("ptrExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xd71,
                "void BinaryenSIMDLoadStoreLaneSetPtr(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenSIMDLoadStoreLaneSetPtr(BinaryenExpressionRef expr,
                                     BinaryenExpressionRef ptrExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDLoadStoreLane>());
  assert(ptrExpr);
  static_cast<SIMDLoadStoreLane*>(expression)->ptr = (Expression*)ptrExpr;
}